

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

int nn_base64_encode(uint8_t *in,size_t in_len,char *out,size_t out_len)

{
  char local_88 [8];
  uint8_t ENCODEMAP [64];
  uint local_40;
  uint uStack_3c;
  uint8_t ch;
  uint32_t v;
  uint rem;
  uint io;
  uint ii;
  size_t out_len_local;
  char *out_local;
  size_t in_len_local;
  uint8_t *in_local;
  
  memcpy(local_88,&DAT_001489d0,0x40);
  v = 0;
  local_40 = 0;
  uStack_3c = 0;
  for (rem = 0; rem < in_len; rem = rem + 1) {
    ENCODEMAP[0x3f] = in[rem];
    local_40 = local_40 << 8 | (uint)in[rem];
    uStack_3c = uStack_3c + 8;
    while (5 < uStack_3c) {
      uStack_3c = uStack_3c - 6;
      if (out_len <= v) {
        return -0x69;
      }
      out[v] = local_88[local_40 >> ((byte)uStack_3c & 0x1f) & 0x3f];
      v = v + 1;
    }
  }
  if (uStack_3c != 0) {
    if (out_len <= v) {
      return -0x69;
    }
    out[v] = local_88[local_40 << (6U - (char)uStack_3c & 0x1f) & 0x3f];
    v = v + 1;
  }
  while( true ) {
    if ((v & 3) == 0) {
      if (v < out_len) {
        out[v] = '\0';
        in_local._4_4_ = v;
      }
      else {
        in_local._4_4_ = 0xffffff97;
      }
      return in_local._4_4_;
    }
    if (out_len <= v) break;
    out[v] = '=';
    v = v + 1;
  }
  return -0x69;
}

Assistant:

int nn_base64_encode (const uint8_t *in, size_t in_len,
    char *out, size_t out_len)
{
    unsigned ii;
    unsigned io;
    unsigned rem;
    uint32_t v;
    uint8_t ch;

    const uint8_t ENCODEMAP [64] =
        "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
        "abcdefghijklmnopqrstuvwxyz"
        "0123456789+/";

    for (io = 0, ii = 0, v = 0, rem = 0; ii < in_len; ii++) {
        ch = in [ii];
        v = (v << 8) | ch;
        rem += 8;
        while (rem >= 6) {
            rem -= 6;
            if (io >= out_len)
                return -ENOBUFS;
            out [io++] = ENCODEMAP [(v >> rem) & 63];
        }
    }

    if (rem) {
        v <<= (6 - rem);
        if (io >= out_len)
            return -ENOBUFS;
        out [io++] = ENCODEMAP [v & 63];
    }

    /*  Pad to a multiple of 3. */
    while (io & 3) {
        if (io >= out_len)
            return -ENOBUFS;
        out [io++] = '=';
    }

    if (io >= out_len)
        return -ENOBUFS;
    
    out [io] = '\0';

    return io;
}